

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd_node.c
# Opt level: O0

void NJDNode_set_string(NJDNode *node,char *str)

{
  size_t sVar1;
  char *pcVar2;
  char *in_RSI;
  long *in_RDI;
  
  if (*in_RDI != 0) {
    free((void *)*in_RDI);
  }
  if ((in_RSI != (char *)0x0) && (sVar1 = strlen(in_RSI), sVar1 != 0)) {
    pcVar2 = strdup(in_RSI);
    *in_RDI = (long)pcVar2;
    return;
  }
  *in_RDI = 0;
  return;
}

Assistant:

void NJDNode_set_string(NJDNode * node, const char *str)
{
   if (node->string != NULL)
      free(node->string);
   if (str == NULL || strlen(str) == 0)
      node->string = NULL;
   else
      node->string = strdup(str);
}